

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basis.cc
# Opt level: O0

bool __thiscall ipx::Basis::TightenLuPivotTol(Basis *this)

{
  ostream *poVar1;
  double dVar2;
  stringstream h_logging_stream;
  double tol;
  double in_stack_fffffffffffffdf8;
  LuUpdate *in_stack_fffffffffffffe00;
  string local_1c0 [32];
  stringstream local_1a0 [16];
  stringstream local_190 [120];
  stringstream *in_stack_fffffffffffffee8;
  Control *in_stack_fffffffffffffef0;
  
  std::unique_ptr<ipx::LuUpdate,_std::default_delete<ipx::LuUpdate>_>::operator->
            ((unique_ptr<ipx::LuUpdate,_std::default_delete<ipx::LuUpdate>_> *)0x80b6b5);
  dVar2 = LuUpdate::pivottol((LuUpdate *)0x80b6bd);
  if (0.05 < dVar2) {
    if (0.25 < dVar2) {
      if (0.5 < dVar2) {
        return false;
      }
      std::unique_ptr<ipx::LuUpdate,_std::default_delete<ipx::LuUpdate>_>::operator->
                ((unique_ptr<ipx::LuUpdate,_std::default_delete<ipx::LuUpdate>_> *)0x80b74d);
      LuUpdate::pivottol(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
    }
    else {
      std::unique_ptr<ipx::LuUpdate,_std::default_delete<ipx::LuUpdate>_>::operator->
                ((unique_ptr<ipx::LuUpdate,_std::default_delete<ipx::LuUpdate>_> *)0x80b71a);
      LuUpdate::pivottol(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
    }
  }
  else {
    std::unique_ptr<ipx::LuUpdate,_std::default_delete<ipx::LuUpdate>_>::operator->
              ((unique_ptr<ipx::LuUpdate,_std::default_delete<ipx::LuUpdate>_> *)0x80b6e7);
    LuUpdate::pivottol(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
  }
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__cxx11::string::string(local_1c0);
  std::__cxx11::stringstream::str((string *)local_1a0);
  std::__cxx11::string::~string(local_1c0);
  poVar1 = std::operator<<((ostream *)(local_1a0 + 0x10)," LU pivot tolerance tightened to ");
  std::unique_ptr<ipx::LuUpdate,_std::default_delete<ipx::LuUpdate>_>::operator->
            ((unique_ptr<ipx::LuUpdate,_std::default_delete<ipx::LuUpdate>_> *)0x80b7cf);
  dVar2 = LuUpdate::pivottol((LuUpdate *)0x80b7d7);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,dVar2);
  std::operator<<(poVar1,'\n');
  Control::hLog(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return true;
}

Assistant:

bool Basis::TightenLuPivotTol() {
    double tol = lu_->pivottol();
    if (tol <= 0.05)
        lu_->pivottol(0.1);
    else if (tol <= 0.25)
        lu_->pivottol(0.3);
    else if (tol <= 0.5)
        lu_->pivottol(0.9);
    else
        return false;
    std::stringstream h_logging_stream;
    h_logging_stream.str(std::string());
    h_logging_stream << " LU pivot tolerance tightened to " << lu_->pivottol() << '\n';
    control_.hLog(h_logging_stream);
    return true;
}